

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O3

void sysbvm_string_setupPrimitives(sysbvm_context_t *context)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  
  sVar1 = (context->roots).stringType;
  sVar2 = sysbvm_function_createPrimitive
                    (context,1,0x1c,(void *)0x0,sysbvm_string_primitive_asString);
  sysbvm_type_setAsStringFunction(context,sVar1,sVar2);
  sVar1 = (context->roots).stringSymbolType;
  sVar2 = sysbvm_function_createPrimitive
                    (context,1,0x1c,(void *)0x0,sysbvm_symbol_primitive_asString);
  sysbvm_type_setAsStringFunction(context,sVar1,sVar2);
  sVar1 = (context->roots).stringSymbolType;
  sVar2 = sysbvm_function_createPrimitive
                    (context,1,0x18,(void *)0x0,sysbvm_symbol_primitive_asString);
  sysbvm_type_setPrintStringFunction(context,sVar1,sVar2);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"printString",1,0x20,(void *)0x0,
             sysbvm_tuple_primitive_defaultPrintString);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).anyValueType,"asString",1,0x20,(void *)0x0,
             sysbvm_tuple_primitive_defaultAsString);
  sVar1 = (context->roots).stringType;
  sVar2 = sysbvm_symbol_internWithString(context,1,"=");
  sysbvm_type_setMethodWithSelector(context,sVar1,sVar2,(context->roots).stringEqualsFunction);
  sVar1 = (context->roots).stringType;
  sVar2 = sysbvm_symbol_internWithString(context,4,"hash");
  sysbvm_type_setMethodWithSelector(context,sVar1,sVar2,(context->roots).stringHashFunction);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).stringType,"--",2,0x1c,(void *)0x0,
             sysbvm_string_primitive_concat);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).stringType,"withoutSuffix:",2,0x1c,(void *)0x0,
             sysbvm_string_primitive_withoutSuffix);
  sysbvm_context_setIntrinsicPrimitiveMethod
            (context,(context->roots).stringType,"asSymbol",1,0x1c,(void *)0x0,
             sysbvm_symbol_primitive_intern);
  return;
}

Assistant:

void sysbvm_string_setupPrimitives(sysbvm_context_t *context)
{
    // String primitives
    {
        sysbvm_type_setAsStringFunction(context, context->roots.stringType, sysbvm_function_createPrimitive(context, 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_string_primitive_asString));
    }

    // StringSymbol primitives.
    {
        sysbvm_type_setAsStringFunction(context, context->roots.stringSymbolType, sysbvm_function_createPrimitive(context, 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_symbol_primitive_asString));
        sysbvm_type_setPrintStringFunction(context, context->roots.stringSymbolType, sysbvm_function_createPrimitive(context, 1, SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_symbol_primitive_asString));
    }

    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "printString", 1, SYSBVM_FUNCTION_FLAGS_VIRTUAL, NULL, sysbvm_tuple_primitive_defaultPrintString);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.anyValueType, "asString", 1, SYSBVM_FUNCTION_FLAGS_VIRTUAL, NULL, sysbvm_tuple_primitive_defaultAsString);
    sysbvm_type_setMethodWithSelector(context, context->roots.stringType, sysbvm_symbol_internWithCString(context, "="), context->roots.stringEqualsFunction);
    sysbvm_type_setMethodWithSelector(context, context->roots.stringType, sysbvm_symbol_internWithCString(context, "hash"), context->roots.stringHashFunction);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.stringType, "--", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_string_primitive_concat);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.stringType, "withoutSuffix:", 2, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_string_primitive_withoutSuffix);
    sysbvm_context_setIntrinsicPrimitiveMethod(context, context->roots.stringType, "asSymbol", 1, SYSBVM_FUNCTION_FLAGS_CORE_PRIMITIVE | SYSBVM_FUNCTION_FLAGS_PURE | SYSBVM_FUNCTION_FLAGS_FINAL, NULL, sysbvm_symbol_primitive_intern);
}